

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

int eatcorpse(obj *otmp)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  char *local_2d0;
  long local_2a8;
  bool local_29a;
  char *local_298;
  long local_260;
  long sick_time;
  char buf_1 [256];
  char local_148 [7];
  boolean cannibal;
  char buf [256];
  long age;
  uint local_30;
  boolean stoneable;
  int retcode;
  boolean uniq;
  long rotted;
  int mnum;
  int tp;
  obj *otmp_local;
  
  bVar11 = false;
  iVar3 = otmp->corpsenm;
  _retcode = 0;
  bVar9 = (mons[iVar3].geno & 0x1000) != 0;
  local_30 = 0;
  if ((((((long)iVar3 & 0x3ffffffffffffffU) == 0xc) ||
       (bVar10 = false, ((long)iVar3 & 0x3ffffffffffffffU) == 0xb)) &&
      (bVar10 = false, u.uprops[8].extrinsic == 0)) &&
     (bVar10 = false, (youmonst.mintrinsics & 0x80) == 0)) {
    bVar1 = poly_when_stoned(youmonst.data);
    bVar10 = bVar1 == '\0';
  }
  if (((((mons[iVar3].mlet == '\x02') || (mons[iVar3].mlet == '\n')) ||
       ((mons[iVar3].mlet == ' ' || ((mons[iVar3].mlet == '\x16' || (mons[iVar3].mlet == '\x19')))))
       ) || ((mons[iVar3].mlet == '\x1f' && (((long)iVar3 & 0x3ffffffffffffffU) != 0x9e)))) ||
     ((((mons[iVar3].mlet == '7' && (((long)iVar3 & 0x3ffffffffffffffU) != 0x106)) &&
       (((long)iVar3 & 0x3ffffffffffffffU) != 0x104)) ||
      ((mons[iVar3].mlet == '6' ||
       ((mons[iVar3].mlet == '*' && (((long)iVar3 & 0x3ffffffffffffffU) != 0xd6)))))))) {
    if ((mons[iVar3].mlet == '\x02') ||
       ((((mons[iVar3].mlet == '\n' || (mons[iVar3].mlet == ' ')) ||
         (((mons[iVar3].mlet == '\x16' || (mons[iVar3].mlet == '\x19')) ||
          ((mons[iVar3].mlet == '\x1f' && (((long)iVar3 & 0x3ffffffffffffffU) != 0x9e)))))) ||
        (((mons[iVar3].mlet == '7' &&
          ((((long)iVar3 & 0x3ffffffffffffffU) != 0x106 &&
           (((long)iVar3 & 0x3ffffffffffffffU) != 0x104)))) || (mons[iVar3].mlet == '6')))))) {
      violated(5);
    }
    else {
      violated(6);
    }
  }
  else {
    violated(7);
  }
  if ((iVar3 != 0x154) && (iVar3 != 0xa3)) {
    lVar4 = peek_at_iced_corpse_age(otmp);
    uVar5 = (ulong)moves;
    iVar2 = rn2(0x14);
    _retcode = (long)(uVar5 - lVar4) / ((long)iVar2 + 10);
    if ((*(uint *)&otmp->field_0x4a & 1) == 0) {
      if ((*(uint *)&otmp->field_0x4a >> 1 & 1) != 0) {
        _retcode = _retcode + -2;
      }
    }
    else {
      _retcode = _retcode + 2;
    }
  }
  if ((((youmonst.data)->mlet == '0') || (((youmonst.data)->mflags2 & 0x100) != 0)) ||
     (youmonst.data == mons + 0x85)) {
    if ((*(uint *)&otmp->field_0x4a >> 0x1b & 1) == 0) {
      if (otmp->oeaten < (uint)mons[otmp->corpsenm].cnutrit) goto LAB_001c7b84;
    }
    else if (otmp->oeaten <= (uint)((ulong)(long)(int)((uint)mons[otmp->corpsenm].cnutrit << 2) / 5)
            ) {
LAB_001c7b84:
      pline("There is no blood left in this corpse!");
      return 3;
    }
    if ((0 < _retcode) || (lVar4 = peek_at_iced_corpse_age(otmp), lVar4 + 5 < (long)(ulong)moves)) {
      pline("The blood in this corpse has coagulated!");
      return 3;
    }
    if ((bVar9) &&
       (((u.uprops[0x23].intrinsic == 0 || (u.uprops[0x24].extrinsic != 0)) ||
        ((u.umonnum != u.umonster && (bVar1 = dmgtype(youmonst.data,0x24), bVar1 != '\0')))))) {
      pcVar6 = "";
      if ((mons[iVar3].mflags2 & 0x80000) == 0) {
        pcVar6 = "the ";
      }
      pcVar7 = s_suffix(mons[iVar3].mname);
      sprintf(local_148,"%s%s corpse",pcVar6,pcVar7);
    }
    else {
      pcVar6 = corpse_xname(otmp,'\x01');
      pcVar6 = the(pcVar6);
      sprintf(local_148,"%s",pcVar6);
    }
    pline("You drain the blood from %s.");
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xf7ffffff | 0x8000000;
  }
  else {
    *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xf7ffffff;
  }
  if (((iVar3 == 8) || (bVar10)) || (_retcode < 6)) {
    if ((((mons[iVar3].mflags1 & 0x8000000) == 0) || (u.uprops[7].extrinsic != 0)) ||
       ((youmonst.mintrinsics & 0x40) != 0)) {
      if (((mons[iVar3].mflags1 & 0x10000000) == 0) || (iVar2 = rn2(5), iVar2 == 0)) {
        if (((5 < _retcode) || ((3 < _retcode && (iVar2 = rn2(5), iVar2 != 0)))) &&
           ((u.uprops[0x34].intrinsic == 0 &&
            ((((youmonst.data)->mlet != ' ' && (youmonst.data != mons + 0xfd)) &&
             (bVar1 = defends(0x21,uwep), bVar1 == '\0')))))) {
          bVar11 = true;
          pcVar6 = "";
          if (u.uprops[0x1d].intrinsic != 0) {
            pcVar6 = "very ";
          }
          pline("You feel %ssick.",pcVar6);
          iVar2 = rnd(8);
          losehp(iVar2,"cadaver",0);
        }
      }
      else {
        bVar11 = true;
        pline("Ecch - that must have been poisonous!");
        if ((((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
            ((youmonst.mintrinsics & 0x20) == 0)) ||
           ((((u.uprops[6].intrinsic & 0x4000000) != 0 &&
             ((u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
            ((u.uprops[6].extrinsic == 0 && ((youmonst.mintrinsics & 0x20) == 0)))))) {
          if (((u.uprops[6].intrinsic == 0) && (u.uprops[6].extrinsic == 0)) &&
             ((youmonst.mintrinsics & 0x20) == 0)) {
            iVar2 = rnd(4);
            losestr(iVar2,'\0');
          }
          bVar10 = false;
          if ((((u.uprops[6].intrinsic & 0x4000000) != 0) &&
              (bVar10 = false, (u.uprops[6].intrinsic & 0xfbffffff) == 0)) &&
             (bVar10 = false, u.uprops[6].extrinsic == 0)) {
            bVar10 = (youmonst.mintrinsics & 0x20) == 0;
          }
          iVar2 = 0xf;
          if (bVar10) {
            iVar2 = 7;
          }
          iVar2 = rnd(iVar2);
          losehp(iVar2,"poisonous corpse",0);
        }
        else {
          pline("You seem unaffected by the poison.");
        }
        exercise(4,'\0');
      }
    }
    else {
      bVar11 = true;
      pline("You have a very bad case of stomach acid.");
      iVar2 = rnd(0xf);
      losehp(iVar2,"acidic corpse",0);
    }
    victual.reqtime = ((int)(uint)mons[iVar3].cwt >> 6) + 3;
    if ((*(uint *)&otmp->field_0x4a >> 0x1b & 1) != 0) {
      victual.reqtime = rounddiv((long)victual.reqtime,5);
    }
    if (((bVar11) || (iVar3 == 0x154)) ||
       ((iVar3 == 0xa3 ||
        (((*(uint *)&otmp->field_0x4a >> 8 & 3) == 0 && (iVar2 = rn2(7), iVar2 != 0)))))) {
      if (((youmonst.data)->mlet != '0') &&
         ((((youmonst.data)->mflags2 & 0x100) == 0 && (youmonst.data != mons + 0x85)))) {
        if (bVar9) {
          local_2d0 = "";
          if ((mons[iVar3].mflags2 & 0x80000) == 0) {
            local_2d0 = "The ";
          }
        }
        else {
          local_2d0 = "This ";
        }
        pcVar6 = food_xname(otmp,'\0');
        if ((((((mons[iVar3].mlet == '\x02') || (mons[iVar3].mlet == '\n')) ||
              (mons[iVar3].mlet == ' ')) ||
             ((mons[iVar3].mlet == '\x16' || (mons[iVar3].mlet == '\x19')))) ||
            ((mons[iVar3].mlet == '\x1f' && (((long)iVar3 & 0x3ffffffffffffffU) != 0x9e)))) ||
           ((((mons[iVar3].mlet == '7' && (((long)iVar3 & 0x3ffffffffffffffU) != 0x106)) &&
             (((long)iVar3 & 0x3ffffffffffffffU) != 0x104)) || (mons[iVar3].mlet == '6')))) {
          bVar11 = false;
          if (((youmonst.data)->mflags1 & 0x20000000) == 0) {
            bVar11 = ((youmonst.data)->mflags1 & 0x40000000) != 0;
          }
        }
        else {
          bVar11 = false;
          if (((youmonst.data)->mflags1 & 0x20000000) != 0) {
            bVar11 = ((youmonst.data)->mflags1 & 0x40000000) == 0;
          }
        }
        pcVar7 = "tastes terrible";
        if (bVar11) {
          pcVar7 = "is delicious";
        }
        pline("%s%s %s!",local_2d0,pcVar6,pcVar7);
      }
    }
    else {
      iVar2 = rottenfood(otmp);
      if (iVar2 != 0) {
        *(uint *)&otmp->field_0x4a = *(uint *)&otmp->field_0x4a & 0xfffffcff | 0x100;
        touchfood(otmp);
      }
      local_30 = (uint)(iVar2 != 0);
      if (mons[otmp->corpsenm].cnutrit == 0) {
        if (local_30 == 0) {
          pline("The corpse rots away completely.");
        }
        if (otmp->where == '\x03') {
          useup(otmp);
        }
        else {
          useupf(otmp,1);
        }
        local_30 = 2;
      }
      if (local_30 == 0) {
        consume_oeaten(otmp,2);
      }
      if (((local_30 < 2) && ((*(uint *)&otmp->field_0x4a >> 0x1b & 1) != 0)) &&
         (otmp->oeaten < ((uint)mons[otmp->corpsenm].cnutrit << 2) / 5)) {
        otmp->oeaten = ((uint)mons[otmp->corpsenm].cnutrit << 2) / 5;
      }
    }
    if (((((mons[iVar3].mflags1 & 4) != 0) || ((mons[iVar3].mflags1 & 0x80000) != 0)) ||
        (mons[iVar3].mlet == '\x02')) &&
       (((mons[iVar3].mlet != '-' && (mons[iVar3].mlet != '(')) &&
        (((mons[iVar3].mlet != '\r' &&
          (((iVar2 = rnf(1,5), iVar2 != 0 && ((youmonst.data)->mlet != '0')) &&
           (((youmonst.data)->mflags2 & 0x100) == 0)))) && (youmonst.data != mons + 0x85)))))) {
      pcVar6 = "slimy";
      if ((mons[iVar3].mflags1 & 4) != 0) {
        pcVar6 = "glibbery";
      }
      pcVar7 = body_part(3);
      pcVar7 = makeplural(pcVar7);
      pcVar8 = "very";
      if (u.uprops[0x29].intrinsic != 0) {
        pcVar8 = "even more";
      }
      pline("Eating this %s corpse makes your %s %s slippery.",pcVar6,pcVar7,pcVar8);
      iVar3 = rnd(0xf);
      incr_itimeout(&u.uprops[0x29].intrinsic,(long)iVar3);
    }
    otmp_local._4_4_ = local_30;
  }
  else {
    bVar1 = maybe_cannibal(iVar3,'\0');
    if (mons[iVar3].mlet == ' ') {
      local_298 = "fungoid vegetation";
    }
    else {
      local_29a = true;
      if (((((mons[iVar3].mlet != '\x02') && (local_29a = true, mons[iVar3].mlet != '\n')) &&
           ((local_29a = true, mons[iVar3].mlet != ' ' &&
            ((local_29a = true, mons[iVar3].mlet != '\x16' &&
             (local_29a = true, mons[iVar3].mlet != '\x19')))))) &&
          ((mons[iVar3].mlet != '\x1f' ||
           (local_29a = true, ((long)iVar3 & 0x3ffffffffffffffU) == 0x9e)))) &&
         ((((mons[iVar3].mlet != '7' || (((long)iVar3 & 0x3ffffffffffffffU) == 0x106)) ||
           (local_29a = true, ((long)iVar3 & 0x3ffffffffffffffU) == 0x104)) &&
          (local_29a = true, mons[iVar3].mlet != '6')))) {
        local_29a = mons[iVar3].mlet == '*' && ((long)iVar3 & 0x3ffffffffffffffU) != 0xd6;
      }
      local_298 = "protoplasm";
      if (!local_29a) {
        local_298 = "meat";
      }
    }
    pcVar6 = "";
    if (bVar1 != '\0') {
      pcVar6 = "; you cannibal";
    }
    pline("Ulch!  That %s was tainted%s!",local_298,pcVar6);
    if (((u.uprops[0x34].intrinsic == 0) && ((youmonst.data)->mlet != ' ')) &&
       ((youmonst.data != mons + 0xfd && (bVar1 = defends(0x21,uwep), bVar1 == '\0')))) {
      iVar2 = rn2(10);
      local_260 = (long)(iVar2 + 10);
      if ((u.uprops[0x1d].intrinsic != 0) && ((long)(ulong)u.uprops[0x1d].intrinsic < local_260)) {
        if (u.uprops[0x1d].intrinsic < 2) {
          local_2a8 = 1;
        }
        else {
          local_2a8 = (ulong)u.uprops[0x1d].intrinsic - 1;
        }
        local_260 = local_2a8;
      }
      if (bVar9) {
        pcVar6 = "";
        if ((mons[iVar3].mflags2 & 0x80000) == 0) {
          pcVar6 = "the ";
        }
        pcVar7 = mons_mname(mons + iVar3);
        pcVar7 = s_suffix(pcVar7);
        sprintf((char *)&sick_time,"%s%s rotted corpse",pcVar6,pcVar7);
      }
      else {
        pcVar6 = corpse_xname(otmp,'\x01');
        sprintf((char *)&sick_time,"rotted %s",pcVar6);
      }
      make_sick(local_260,(char *)&sick_time,'\x01',1);
    }
    else {
      pline("It doesn\'t seem at all sickening, though...");
    }
    if (otmp->where == '\x03') {
      useup(otmp);
    }
    else {
      useupf(otmp,1);
    }
    otmp_local._4_4_ = 2;
  }
  return otmp_local._4_4_;
}

Assistant:

static int eatcorpse(struct obj *otmp)
{
	int tp = 0, mnum = otmp->corpsenm;
	long rotted = 0L;
	boolean uniq = !!(mons[mnum].geno & G_UNIQ);
	int retcode = 0;
	boolean stoneable = (touch_petrifies(&mons[mnum]) && !Stone_resistance &&
				!poly_when_stoned(youmonst.data));

	/* KMH, conduct */
	/* eating a corpse breaks food-conducts here */
	if (!vegetarian(&mons[mnum])) violated(CONDUCT_VEGETARIAN);
	else if (!vegan(&mons[mnum])) violated(CONDUCT_VEGAN);
	else violated(CONDUCT_FOODLESS);

	if (mnum != PM_LIZARD && mnum != PM_LICHEN) {
		long age = peek_at_iced_corpse_age(otmp);

		rotted = (moves - age)/(10L + rn2(20));
		if (otmp->cursed) rotted += 2L;
		else if (otmp->blessed) rotted -= 2L;
	}

	/* Vampires only drink the blood of very young, meaty corpses.
	 * is_edible only allows meaty corpses here.
	 * Blood is assumed to be 1/5 of the nutrition.
	 * Thus happens before the conduct checks intentionally - should it be after?
	 * Blood is assumed to be meat and flesh.
	 */
	if (is_vampiric(youmonst.data)) {
		/* oeaten is set up by touchfood */
		if (otmp->odrained ?
		    otmp->oeaten <= drainlevel(otmp) :
		    otmp->oeaten < mons[otmp->corpsenm].cnutrit) {
			pline("There is no blood left in this corpse!");
			return 3;
		} else if (rotted <= 0 &&
			   peek_at_iced_corpse_age(otmp) + 5 >= moves) {
			char buf[BUFSZ];

			/* Generate the name for the corpse */
			if (!uniq || Hallucination)
				sprintf(buf, "%s", the(corpse_xname(otmp, TRUE)));
			else
				sprintf(buf, "%s%s corpse",
					!type_is_pname(&mons[mnum]) ? "the " : "",
					s_suffix(mons[mnum].mname));

			pline("You drain the blood from %s.", buf);
			otmp->odrained = 1;
		} else {
			pline("The blood in this corpse has coagulated!");
			return 3;
		}
	} else {
		otmp->odrained = 0;
	}

	if (mnum != PM_ACID_BLOB && !stoneable && rotted > 5L) {
		boolean cannibal = maybe_cannibal(mnum, FALSE);
		pline("Ulch!  That %s was tainted%s!",
		      mons[mnum].mlet == S_FUNGUS ? "fungoid vegetation" :
		      !vegetarian(&mons[mnum]) ? "meat" : "protoplasm",
		      cannibal ? "; you cannibal" : "");
		if (Sick_resistance) {
			pline("It doesn't seem at all sickening, though...");
		} else {
			char buf[BUFSZ];
			long sick_time;

			sick_time = (long) rn1(10, 10);
			/* make sure new ill doesn't result in improvement */
			if (Sick && (sick_time > Sick))
			    sick_time = (Sick > 1L) ? Sick - 1L : 1L;
			if (!uniq)
			    sprintf(buf, "rotted %s", corpse_xname(otmp,TRUE));
			else
			    sprintf(buf, "%s%s rotted corpse",
				    !type_is_pname(&mons[mnum]) ? "the " : "",
				    s_suffix(mons_mname(&mons[mnum])));
			make_sick(sick_time, buf, TRUE, SICK_VOMITABLE);
		}
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		return 2;
	} else if (acidic(&mons[mnum]) && !Acid_resistance) {
		tp++;
		pline("You have a very bad case of stomach acid."); /* not body_part() */
		losehp(rnd(15), "acidic corpse", KILLED_BY_AN);
	} else if (poisonous(&mons[mnum]) && rn2(5)) {
		tp++;
		pline("Ecch - that must have been poisonous!");
		if (!FPoison_resistance) {
			if (!Poison_resistance)
			    losestr(rnd(4), FALSE);
			losehp(rnd(PPoison_resistance ? 7 : 15),
			       "poisonous corpse", KILLED_BY_AN);
		} else	pline("You seem unaffected by the poison.");
		exercise(A_CON, FALSE);
	/* now any corpse left too long will make you mildly ill */
	} else if ((rotted > 5L || (rotted > 3L && rn2(5)))
					&& !Sick_resistance) {
		tp++;
		pline("You feel %ssick.", (Sick) ? "very " : "");
		losehp(rnd(8), "cadaver", KILLED_BY_AN);
	}

	/* delay is weight dependent */
	victual.reqtime = 3 + (mons[mnum].cwt >> 6);
	if (otmp->odrained)
		victual.reqtime = rounddiv(victual.reqtime, 5);

	if (!tp && mnum != PM_LIZARD && mnum != PM_LICHEN &&
			(otmp->orotten || !rn2(7))) {
	    if (rottenfood(otmp)) {
		otmp->orotten = TRUE;
		touchfood(otmp);
		retcode = 1;
	    }

	    if (!mons[otmp->corpsenm].cnutrit) {
		/* no nutrution: rots away, no message if you passed out */
		if (!retcode) pline("The corpse rots away completely.");
		if (carried(otmp)) useup(otmp);
		else useupf(otmp, 1L);
		retcode = 2;
	    }

	    if (!retcode) consume_oeaten(otmp, 2);	/* oeaten >>= 2 */
	    if (retcode < 2 && otmp->odrained && otmp->oeaten < drainlevel(otmp))
		otmp->oeaten = drainlevel(otmp);
	} else if (!is_vampiric(youmonst.data)) {
	    pline("%s%s %s!",
		  !uniq ? "This " : !type_is_pname(&mons[mnum]) ? "The " : "",
		  food_xname(otmp, FALSE),
		  (vegan(&mons[mnum]) ?
		   (!carnivorous(youmonst.data) && herbivorous(youmonst.data)) :
		   (carnivorous(youmonst.data) && !herbivorous(youmonst.data)))
		  ? "is delicious" : "tastes terrible");
	}

	/* Eating slimy or oily corpses makes your fingers slippery.
	 * Note: Snakes are not slimy. */
	if ((amorphous(&mons[mnum]) || slithy(&mons[mnum]) ||
	     mons[mnum].mlet == S_BLOB) &&
	    mons[mnum].mlet != S_SNAKE && mons[mnum].mlet != S_NAGA &&
	    mons[mnum].mlet != S_MIMIC && rnf(1,5) &&
	    !is_vampiric(youmonst.data)) {
	    pline("Eating this %s corpse makes your %s %s slippery.",
		  amorphous(&mons[mnum]) ? "glibbery" : "slimy",
		  makeplural(body_part(FINGER)),
		  Glib ? "even more" : "very");
	    incr_itimeout(&Glib, rnd(15));
	}

	return retcode;
}